

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::SwiftConstant_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,FieldDef *field)

{
  string *s;
  bool bVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  s = &(field->value).constant;
  bVar1 = StringIsFlatbufferNan(s);
  if (bVar1) {
    __s = ".nan";
    __a = &local_19;
  }
  else {
    bVar1 = StringIsFlatbufferPositiveInfinity(s);
    if (bVar1) {
      __s = ".infinity";
      __a = &local_1a;
    }
    else {
      bVar1 = StringIsFlatbufferNegativeInfinity(s);
      if (bVar1) {
        __s = "-.infinity";
        __a = &local_1b;
      }
      else {
        if ((field->value).type.base_type != BASE_TYPE_BOOL) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
          return __return_storage_ptr__;
        }
        bVar1 = std::operator==("0",s);
        __s = "true";
        if (bVar1) {
          __s = "false";
        }
        __a = &local_1c;
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string SwiftConstant(const FieldDef &field) {
    const auto default_value =
        StringIsFlatbufferNan(field.value.constant)                ? ".nan"
        : StringIsFlatbufferPositiveInfinity(field.value.constant) ? ".infinity"
        : StringIsFlatbufferNegativeInfinity(field.value.constant)
            ? "-.infinity"
        : IsBool(field.value.type.base_type)
            ? ("0" == field.value.constant ? "false" : "true")
            : field.value.constant;
    return default_value;
  }